

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Performance::anon_unknown_1::
RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>::
logAndSetTestResult(RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
                    *this,vector<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>::SampleResult>_>
                          *results)

{
  undefined8 uVar1;
  TestContext *this_00;
  long lVar2;
  pointer pRVar3;
  long lVar4;
  int precision;
  undefined8 *puVar5;
  pointer pRVar6;
  pointer pSVar7;
  undefined8 *puVar8;
  long lVar9;
  undefined8 *puVar10;
  void *pvVar11;
  ulong uVar12;
  byte bVar13;
  RenderSampleAnalyzeResult RVar14;
  vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
  mappedResults;
  vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
  local_88;
  string local_70;
  void *local_50;
  long local_48;
  ulong local_40;
  RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
  *local_38;
  
  bVar13 = 0;
  local_88.
  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar2 = (long)(results->
                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>::SampleResult>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(results->
                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>::SampleResult>_>
                )._M_impl.super__Vector_impl_data._M_start >> 3;
  uVar12 = lVar2 * 0x2e8ba2e8ba2e8ba3;
  pvVar11 = (void *)0x0;
  if (uVar12 != 0) {
    if (uVar12 == 0) {
      _DAT_00000030 = 0;
      _DAT_00000038 = 0;
      uRam0000000000000020 = 0;
      uRam0000000000000028 = 0;
      uRam0000000000000010 = 0;
      uRam0000000000000018 = 0;
      uRam0000000000000000 = 0;
      uRam0000000000000008 = 0;
      uRam0000000000000040 = 0;
      local_88.
      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)(lVar2 * 0x1745d1745d1745d8);
      puVar10 = (undefined8 *)&DAT_00000048;
      do {
        puVar5 = (undefined8 *)0x0;
        puVar8 = puVar10;
        for (lVar9 = 9; lVar9 != 0; lVar9 = lVar9 + -1) {
          *puVar8 = *puVar5;
          puVar5 = puVar5 + 1;
          puVar8 = puVar8 + 1;
        }
        puVar10 = puVar10 + 9;
      } while ((undefined8 *)(lVar2 * 0x1745d1745d1745d8) != puVar10);
    }
    else {
      if (0x1c71c71c71c71c7 < uVar12) {
        std::__throw_length_error("vector::_M_default_append");
      }
      local_48 = 0;
      local_40 = uVar12;
      if (uVar12 == 0 && lVar2 * -0x2e8ba2e8ba2e8ba3 != 0) {
        local_40 = 0;
      }
      if (0x1c71c71c71c71c6 < local_40) {
        local_40 = 0x1c71c71c71c71c7;
      }
      local_38 = this;
      if (local_40 == 0) {
        pRVar3 = (pointer)0x0;
      }
      else {
        local_50 = (void *)0x0;
        pRVar3 = (pointer)operator_new(local_40 * 0x48);
        pvVar11 = local_50;
      }
      (pRVar3->duration).totalDuration = 0;
      (pRVar3->duration).renderReadDuration = 0;
      (pRVar3->duration).secondRenderDuration = 0;
      (pRVar3->duration).readDuration = 0;
      (pRVar3->duration).firstRenderDuration = 0;
      (pRVar3->duration).uploadDuration = 0;
      pRVar3->uploadedDataSize = 0;
      pRVar3->renderDataSize = 0;
      pRVar3->unrelatedDataSize = 0;
      pRVar3->numVertices = 0;
      (pRVar3->duration).fitResponseDuration = 0;
      if ((uVar12 - 1 != 0) && ((uVar12 - 1) * 0x48 != 0)) {
        lVar9 = 0x48;
        do {
          pRVar6 = pRVar3;
          puVar10 = (undefined8 *)((long)&pRVar3->uploadedDataSize + lVar9);
          for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
            *puVar10 = *(undefined8 *)pRVar6;
            pRVar6 = (pointer)((long)pRVar6 + (ulong)bVar13 * -0x10 + 8);
            puVar10 = puVar10 + (ulong)bVar13 * -2 + 1;
          }
          lVar9 = lVar9 + 0x48;
        } while (lVar2 * 0x1745d1745d1745d8 != lVar9);
      }
      if (pvVar11 != (void *)0x0) {
        operator_delete(pvVar11,local_48 - (long)pvVar11);
      }
      local_88.
      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)(lVar2 * 0x1745d1745d1745d8 + (long)pRVar3);
      local_88.
      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pRVar3 + local_40;
      this = local_38;
      local_88.
      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
      ._M_impl.super__Vector_impl_data._M_start = pRVar3;
    }
  }
  pSVar7 = (results->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>::SampleResult>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(results->
                              super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>::SampleResult>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pSVar7) >> 3) *
          -0x45d1745d) {
    lVar2 = 0x10;
    lVar9 = 0;
    pRVar3 = local_88.
             super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      puVar10 = (undefined8 *)((long)&(pSVar7->scene).gridWidth + lVar2);
      pRVar6 = pRVar3;
      for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
        uVar1 = *puVar10;
        pRVar6->uploadedDataSize = (int)uVar1;
        pRVar6->renderDataSize = (int)((ulong)uVar1 >> 0x20);
        puVar10 = puVar10 + (ulong)bVar13 * -2 + 1;
        pRVar6 = (pointer)((long)pRVar6 + (ulong)bVar13 * -0x10 + 8);
      }
      pSVar7 = (results->
               super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>::SampleResult>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar9 = lVar9 + 1;
      pRVar3 = pRVar3 + 1;
      lVar2 = lVar2 + 0x58;
    } while (lVar9 < (int)((ulong)((long)(results->
                                         super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>::SampleResult>_>
                                         )._M_impl.super__Vector_impl_data._M_finish - (long)pSVar7)
                          >> 3) * -0x45d1745d);
  }
  RVar14 = analyzeSampleResults<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
                     (((this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.
                       super_TestNode.m_testCtx)->m_log,&local_88);
  this_00 = (this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.super_TestNode.
            m_testCtx;
  if (RVar14.renderRateAtRange < INFINITY) {
    de::floatToString_abi_cxx11_
              (&local_70,(de *)0x2,RVar14.renderRateAtRange * 0.0009765625 * 0.0009765625,precision)
    ;
    tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_PASS,local_70._M_dataplus._M_p);
  }
  else {
    de::floatToString_abi_cxx11_(&local_70,(de *)0x2,0.0,precision);
    tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_PASS,local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_88.
      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.
                    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.
                          super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.
                          super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void RenderCase<SampleType>::logAndSetTestResult (const std::vector<SampleResult>& results)
{
	std::vector<RenderSampleResult<SampleType> > mappedResults;

	mapResultsToRenderRateFormat(mappedResults, results);

	{
		const RenderSampleAnalyzeResult	analysis	= analyzeSampleResults(m_testCtx.getLog(), mappedResults);
		const float						rate		= analysis.renderRateAtRange;

		if (rate == std::numeric_limits<float>::infinity())
		{
			// sample times are 1) invalid or 2) timer resolution too low
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, de::floatToString(0.0f, 2).c_str());
		}
		else
		{
			// report transfer rate in millions of MiB/s
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, de::floatToString(rate / 1024.0f / 1024.0f, 2).c_str());
		}
	}
}